

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O2

REF_STATUS ref_metric_imply_from(REF_DBL *metric,REF_GRID ref_grid)

{
  double dVar1;
  double dVar2;
  int iVar3;
  REF_NODE ref_node;
  REF_CELL pRVar4;
  REF_STATUS RVar5;
  uint uVar6;
  REF_STATUS RVar7;
  REF_DBL *total_node_volume;
  long lVar8;
  ulong uVar9;
  REF_DBL *pRVar10;
  ulong uVar11;
  long lVar12;
  undefined8 uVar13;
  char *pcVar14;
  int iVar15;
  long lVar16;
  double dVar17;
  double dVar18;
  double local_180;
  REF_INT nodes [27];
  REF_DBL log_m [6];
  REF_DBL m [6];
  REF_DBL log_m_1 [6];
  
  ref_node = ref_grid->node;
  lVar16 = (long)ref_node->max;
  if (lVar16 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0x634,
           "ref_metric_imply_from","malloc total_node_volume of REF_DBL negative");
    return 1;
  }
  total_node_volume = (REF_DBL *)malloc(lVar16 * 8);
  if (total_node_volume == (REF_DBL *)0x0) {
    RVar5 = 2;
    pcVar14 = "malloc total_node_volume of REF_DBL NULL";
    uVar13 = 0x634;
LAB_001aef5b:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar13
           ,"ref_metric_imply_from",pcVar14);
    return RVar5;
  }
  for (lVar8 = 0; lVar16 != lVar8; lVar8 = lVar8 + 1) {
    total_node_volume[lVar8] = 0.0;
  }
  pRVar10 = metric;
  for (lVar8 = 0; lVar8 != lVar16; lVar8 = lVar8 + 1) {
    for (lVar12 = 0; lVar12 != 6; lVar12 = lVar12 + 1) {
      pRVar10[lVar12] = 0.0;
    }
    pRVar10 = pRVar10 + 6;
  }
  if (ref_grid->twod != 0) {
    pRVar4 = ref_grid->cell[3];
    for (iVar15 = 0; iVar15 < pRVar4->max; iVar15 = iVar15 + 1) {
      RVar5 = ref_cell_nodes(pRVar4,iVar15,nodes);
      if (RVar5 == 0) {
        m[0]._0_4_ = nodes[0];
        m[0]._4_4_ = nodes[1];
        m[1]._0_4_ = nodes[2];
        pRVar10 = ref_node->real;
        RVar5 = ref_matrix_imply_m3(log_m,pRVar10 + (long)nodes[0] * 0xf,
                                    pRVar10 + (long)nodes[1] * 0xf,pRVar10 + (long)nodes[2] * 0xf);
        if (RVar5 == 0) {
          uVar6 = ref_matrix_log_m(log_m,log_m_1);
          if (uVar6 == 0) {
            uVar6 = ref_node_tri_area(ref_node,(REF_INT *)m,&local_180);
            if (uVar6 == 0) {
              uVar9 = (ulong)(uint)pRVar4->node_per;
              if (pRVar4->node_per < 1) {
                uVar9 = 0;
              }
              for (uVar11 = 0; uVar11 != uVar9; uVar11 = uVar11 + 1) {
                iVar3 = nodes[uVar11];
                total_node_volume[iVar3] = total_node_volume[iVar3] + local_180;
                for (lVar16 = 0; lVar16 != 6; lVar16 = lVar16 + 1) {
                  metric[iVar3 * 6 + lVar16] =
                       log_m_1[lVar16] * local_180 + metric[iVar3 * 6 + lVar16];
                }
              }
              goto LAB_001aed1b;
            }
            pcVar14 = "area";
            uVar13 = 0x61e;
          }
          else {
            pcVar14 = "log";
            uVar13 = 0x61d;
          }
          uVar9 = (ulong)uVar6;
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 uVar13,"add_sub_tri",uVar9,pcVar14);
          pcVar14 = "tet sub tet";
          uVar13 = 0x63e;
          goto LAB_001af458;
        }
      }
LAB_001aed1b:
    }
  }
  pRVar4 = ref_grid->cell[8];
  for (iVar15 = 0; iVar15 < pRVar4->max; iVar15 = iVar15 + 1) {
    RVar5 = ref_cell_nodes(pRVar4,iVar15,nodes);
    if ((RVar5 == 0) &&
       (uVar6 = add_sub_tet(0,1,2,3,nodes,metric,total_node_volume,ref_node,pRVar4), uVar6 != 0)) {
      uVar9 = (ulong)uVar6;
      pcVar14 = "tet sub tet";
      uVar13 = 0x646;
      goto LAB_001af458;
    }
  }
  pRVar4 = ref_grid->cell[10];
  for (iVar15 = 0; iVar15 < pRVar4->max; iVar15 = iVar15 + 1) {
    RVar5 = ref_cell_nodes(pRVar4,iVar15,nodes);
    if (RVar5 == 0) {
      uVar6 = add_sub_tet(0,4,5,3,nodes,metric,total_node_volume,ref_node,pRVar4);
      if (uVar6 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x64d,"ref_metric_imply_from",(ulong)uVar6,"pri sub tet");
        return uVar6;
      }
      uVar6 = add_sub_tet(0,1,5,4,nodes,metric,total_node_volume,ref_node,pRVar4);
      if (uVar6 != 0) {
        pcVar14 = "pri sub tet";
        uVar13 = 0x650;
        goto LAB_001af217;
      }
      uVar6 = add_sub_tet(0,1,2,5,nodes,metric,total_node_volume,ref_node,pRVar4);
      if (uVar6 != 0) {
        uVar9 = (ulong)uVar6;
        pcVar14 = "pri sub tet";
        uVar13 = 0x653;
        goto LAB_001af458;
      }
    }
  }
  pRVar4 = ref_grid->cell[9];
  for (iVar15 = 0; iVar15 < pRVar4->max; iVar15 = iVar15 + 1) {
    RVar5 = ref_cell_nodes(pRVar4,iVar15,nodes);
    if (RVar5 == 0) {
      uVar6 = add_sub_tet(0,4,1,2,nodes,metric,total_node_volume,ref_node,pRVar4);
      if (uVar6 == 0) {
        uVar6 = add_sub_tet(0,3,4,2,nodes,metric,total_node_volume,ref_node,pRVar4);
        if (uVar6 == 0) goto LAB_001af00b;
        uVar13 = 0x65d;
      }
      else {
        uVar13 = 0x65a;
      }
      pcVar14 = "pyr sub tet";
      uVar9 = (ulong)uVar6;
      goto LAB_001af45b;
    }
LAB_001af00b:
  }
  pRVar4 = ref_grid->cell[0xb];
  RVar5 = 1;
  for (iVar15 = 0; iVar15 < pRVar4->max; iVar15 = iVar15 + 1) {
    RVar7 = ref_cell_nodes(pRVar4,iVar15,nodes);
    if (RVar7 == 0) {
      uVar6 = add_sub_tet(0,5,7,4,nodes,metric,total_node_volume,ref_node,pRVar4);
      if (uVar6 != 0) {
        pcVar14 = "hex sub tet";
        uVar13 = 0x664;
LAB_001af217:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               uVar13,"ref_metric_imply_from",(ulong)uVar6,pcVar14);
        return uVar6;
      }
      uVar6 = add_sub_tet(0,1,7,5,nodes,metric,total_node_volume,ref_node,pRVar4);
      if (uVar6 != 0) {
        pcVar14 = "hex sub tet";
        uVar13 = 0x667;
        goto LAB_001af217;
      }
      uVar6 = add_sub_tet(1,6,7,5,nodes,metric,total_node_volume,ref_node,pRVar4);
      if (uVar6 != 0) {
        pcVar14 = "hex sub tet";
        uVar13 = 0x66a;
        goto LAB_001af217;
      }
      uVar6 = add_sub_tet(0,7,2,3,nodes,metric,total_node_volume,ref_node,pRVar4);
      if (uVar6 != 0) {
        pcVar14 = "hex sub tet";
        uVar13 = 0x66e;
        goto LAB_001af217;
      }
      uVar6 = add_sub_tet(0,7,1,2,nodes,metric,total_node_volume,ref_node,pRVar4);
      if (uVar6 != 0) {
        pcVar14 = "hex sub tet";
        uVar13 = 0x671;
        goto LAB_001af217;
      }
      uVar6 = add_sub_tet(1,7,6,2,nodes,metric,total_node_volume,ref_node,pRVar4);
      if (uVar6 != 0) {
        pcVar14 = "hex sub tet";
        uVar13 = 0x674;
        goto LAB_001af217;
      }
    }
  }
  lVar16 = 0;
  pRVar10 = metric;
  do {
    if (ref_node->max <= lVar16) {
      free(total_node_volume);
      uVar6 = ref_node_ghost_dbl(ref_node,metric,6);
      if (uVar6 == 0) {
        uVar6 = 0;
      }
      else {
        uVar9 = (ulong)uVar6;
        pcVar14 = "update ghosts";
        uVar13 = 0x687;
LAB_001af458:
        uVar6 = (uint)uVar9;
LAB_001af45b:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               uVar13,"ref_metric_imply_from",uVar9,pcVar14);
      }
      return uVar6;
    }
    if ((-1 < ref_node->global[lVar16]) && (ref_node->ref_mpi->id == ref_node->part[lVar16])) {
      dVar1 = total_node_volume[lVar16];
      if (dVar1 <= 0.0) {
        pcVar14 = "zero metric contributions";
        uVar13 = 0x679;
        goto LAB_001aef5b;
      }
      dVar17 = dVar1 * 1e+20;
      if (dVar17 <= -dVar17) {
        dVar17 = -dVar17;
      }
      for (lVar8 = 0; lVar8 != 6; lVar8 = lVar8 + 1) {
        dVar2 = pRVar10[lVar8];
        dVar18 = dVar2;
        if (dVar2 <= -dVar2) {
          dVar18 = -dVar2;
        }
        if (dVar17 <= dVar18) {
          pcVar14 = "zero volume";
          uVar13 = 0x67c;
          uVar9 = 4;
          goto LAB_001af458;
        }
        log_m[lVar8] = dVar2 / dVar1;
      }
      uVar6 = ref_matrix_exp_m(log_m,m);
      if (uVar6 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x67f,"ref_metric_imply_from",(ulong)uVar6,"exp");
        return uVar6;
      }
      for (lVar8 = 0; lVar8 != 6; lVar8 = lVar8 + 1) {
        pRVar10[lVar8] = m[lVar8];
      }
      total_node_volume[lVar16] = 0.0;
    }
    lVar16 = lVar16 + 1;
    pRVar10 = pRVar10 + 6;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_metric_imply_from(REF_DBL *metric, REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL m[6], log_m[6];
  REF_DBL *total_node_volume;
  REF_INT node, im;
  REF_INT cell;
  REF_CELL ref_cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];

  ref_malloc_init(total_node_volume, ref_node_max(ref_node), REF_DBL, 0.0);

  for (node = 0; node < ref_node_max(ref_node); node++)
    for (im = 0; im < 6; im++) metric[im + 6 * node] = 0.0;

  if (ref_grid_twod(ref_grid)) {
    ref_cell = ref_grid_tri(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(add_sub_tri(0, 1, 2, nodes, metric, total_node_volume, ref_node,
                      ref_cell),
          "tet sub tet");
    }
  }

  ref_cell = ref_grid_tet(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(add_sub_tet(0, 1, 2, 3, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "tet sub tet");
  }

  ref_cell = ref_grid_pri(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(add_sub_tet(0, 4, 5, 3, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "pri sub tet");
    RSS(add_sub_tet(0, 1, 5, 4, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "pri sub tet");
    RSS(add_sub_tet(0, 1, 2, 5, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "pri sub tet");
  }

  ref_cell = ref_grid_pyr(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(add_sub_tet(0, 4, 1, 2, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "pyr sub tet");
    RSS(add_sub_tet(0, 3, 4, 2, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "pyr sub tet");
  }

  ref_cell = ref_grid_hex(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(add_sub_tet(0, 5, 7, 4, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "hex sub tet");
    RSS(add_sub_tet(0, 1, 7, 5, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "hex sub tet");
    RSS(add_sub_tet(1, 6, 7, 5, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "hex sub tet");

    RSS(add_sub_tet(0, 7, 2, 3, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "hex sub tet");
    RSS(add_sub_tet(0, 7, 1, 2, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "hex sub tet");
    RSS(add_sub_tet(1, 7, 6, 2, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "hex sub tet");
  }

  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      RAS(0.0 < total_node_volume[node], "zero metric contributions");
      for (im = 0; im < 6; im++) {
        if (!ref_math_divisible(metric[im + 6 * node], total_node_volume[node]))
          RSS(REF_DIV_ZERO, "zero volume");
        log_m[im] = metric[im + 6 * node] / total_node_volume[node];
      }
      RSS(ref_matrix_exp_m(log_m, m), "exp");
      for (im = 0; im < 6; im++) metric[im + 6 * node] = m[im];
      total_node_volume[node] = 0.0;
    }
  }

  ref_free(total_node_volume);

  RSS(ref_node_ghost_dbl(ref_node, metric, 6), "update ghosts");

  return REF_SUCCESS;
}